

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O2

bool tinyxml2::XMLUtil::IsNameStartChar(uchar ch)

{
  int iVar1;
  bool bVar2;
  
  bVar2 = true;
  if (-1 < (char)ch) {
    iVar1 = isalpha((uint)ch);
    if (iVar1 == 0) {
      bVar2 = ch == '_' || ch == ':';
    }
  }
  return bVar2;
}

Assistant:

inline static bool IsNameStartChar( unsigned char ch ) {
        if ( ch >= 128 ) {
            // This is a heuristic guess in attempt to not implement Unicode-aware isalpha()
            return true;
        }
        if ( isalpha( ch ) ) {
            return true;
        }
        return ch == ':' || ch == '_';
    }